

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O2

void __thiscall pg::Game::write_pgsolver(Game *this,ostream *os)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  int i;
  long lVar4;
  int *piVar5;
  
  poVar3 = std::operator<<(os,"parity ");
  poVar3 = std::ostream::_M_insert<long>((long)poVar3);
  poVar3 = std::operator<<(poVar3,";");
  std::endl<char,std::char_traits<char>>(poVar3);
  for (lVar4 = 0; lVar4 < this->n_vertices; lVar4 = lVar4 + 1) {
    poVar3 = (ostream *)std::ostream::operator<<(os,(int)lVar4);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->_priority[lVar4]);
    poVar3 = std::operator<<(poVar3," ");
    iVar2 = owner(this,(int)lVar4);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    std::operator<<(poVar3," ");
    bVar1 = true;
    for (piVar5 = this->_outedges + this->_firstouts[lVar4]; iVar2 = *piVar5, iVar2 != -1;
        piVar5 = piVar5 + 1) {
      if (!bVar1) {
        std::operator<<(os,",");
        iVar2 = *piVar5;
      }
      std::ostream::operator<<(os,iVar2);
      bVar1 = false;
    }
    if ((this->_label[lVar4] != (string *)0x0) && (this->_label[lVar4]->_M_string_length != 0)) {
      poVar3 = std::operator<<(os," \"");
      poVar3 = std::operator<<(poVar3,(string *)this->_label[lVar4]);
      std::operator<<(poVar3,"\"");
    }
    poVar3 = std::operator<<(os,";");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  return;
}

Assistant:

void
Game::write_pgsolver(std::ostream &os)
{
    // print banner
    os << "parity " << n_vertices << ";" << std::endl;

    // print vertices
    for (int i=0; i<n_vertices; i++) {
        os << i << " " << priority(i) << " " << owner(i) << " ";
        bool first = true;
        for (auto curedge = outs(i); *curedge != -1; curedge++) {
            if (first) first = false;
            else os << ",";
            os << *curedge;
        }
        if (_label[i] != 0 and !_label[i]->empty()) os << " \"" << *_label[i] << "\"";
        os << ";" << std::endl;
    }
}